

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_psx_Thread.cpp
# Opt level: O0

bool __thiscall axl::sys::psx::Thread::detach(Thread *this)

{
  int iVar1;
  pthread_t *in_RDI;
  int result;
  uint_t in_stack_ffffffffffffffdc;
  ErrorRef *in_stack_ffffffffffffffe0;
  bool local_1;
  
  if ((in_RDI[1] & 1) == 0) {
    local_1 = true;
  }
  else {
    iVar1 = pthread_detach(*in_RDI);
    if (iVar1 == 0) {
      *(undefined1 *)(in_RDI + 1) = 0;
      local_1 = true;
    }
    else {
      err::ErrorRef::ErrorRef(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
      local_1 = err::fail((ErrorRef *)0x1a9293);
      err::ErrorRef::~ErrorRef((ErrorRef *)0x1a92ad);
    }
  }
  return local_1;
}

Assistant:

bool
Thread::detach() {
	if (!m_isOpen)
		return true;

	int result = ::pthread_detach(m_threadId);
	if (result != 0)
		return err::fail(result);

	m_isOpen = false;
	return true;
}